

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_bfins_32_d(void)

{
  uint uVar1;
  uint uVar2;
  sbyte sVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) != 0) {
    my_fc_handler(m68ki_cpu.s_flag | 2);
    uVar5 = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar5 = pmmu_translate_addr(uVar5);
    }
    uVar1 = m68k_read_memory_16(uVar5 & m68ki_cpu.address_mask);
    uVar5 = uVar1 >> 6;
    uVar4 = uVar1 >> 10;
    if ((uVar1 >> 0xb & 1) != 0) {
      uVar5 = m68ki_cpu.dar[uVar5 & 7];
    }
    uVar2 = uVar5 & 0x1f;
    if ((uVar1 & 0x20) != 0) {
      uVar1 = m68ki_cpu.dar[uVar1 & 7];
    }
    uVar7 = -1 << (-(char)uVar1 & 0x1fU);
    sVar3 = (sbyte)uVar2;
    uVar8 = uVar7 << (0x20U - sVar3 & 0x3f) & 0xfffffffe;
    uVar6 = (ulong)*(uint *)((long)m68ki_cpu.dar + (ulong)(uVar4 & 0x1c)) << (-(char)uVar1 & 0x1fU);
    uVar4 = (uint)(uVar6 << (0x20U - sVar3 & 0x3f)) & 0xfffffffe;
    if (uVar2 == 0) {
      uVar8 = 0;
    }
    m68ki_cpu.not_z_flag = (uint)uVar6;
    if (uVar2 == 0) {
      uVar4 = 0;
    }
    m68ki_cpu.n_flag = (uint)(uVar6 >> 0x18) & 0xff;
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    m68ki_cpu.dar[m68ki_cpu.ir & 7] =
         ~(uVar7 >> sVar3 | uVar8) & m68ki_cpu.dar[m68ki_cpu.ir & 7] |
         (uint)((uVar6 & 0xffffffff) >> sVar3) | uVar4;
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_bfins_32_d(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		uint offset = (word2>>6)&31;
		uint width = word2;
		uint* data = &DY;
		uint64 mask;
		uint64 insert = REG_D[(word2>>12)&7];


		if(BIT_B(word2))
			offset = REG_D[offset&7];
		if(BIT_5(word2))
			width = REG_D[width&7];


		offset &= 31;
		width = ((width-1) & 31) + 1;


		mask = MASK_OUT_ABOVE_32(0xffffffff << (32 - width));
		mask = ROR_32(mask, offset);

		insert = MASK_OUT_ABOVE_32(insert << (32 - width));
		FLAG_N = NFLAG_32(insert);
		FLAG_Z = insert;
		insert = ROR_32(insert, offset);

		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		*data &= ~mask;
		*data |= insert;
		return;
	}
	m68ki_exception_illegal();
}